

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::combineRelationalConstants
          (OptimizeInstructions *this,Binary *binary,Binary *left,Const *leftConst,Binary *right,
          Const *rightConst)

{
  ulong uVar1;
  undefined1 local_60 [8];
  Literal extra;
  
  uVar1 = (binary->right->type).id;
  Literal::Literal((Literal *)local_60,&leftConst->value);
  if (uVar1 < 7) {
    if (left->op == *(BinaryOp *)(&DAT_00df92e4 + uVar1 * 4)) {
      Literal::neg((Literal *)&extra.type,(Literal *)local_60);
      Literal::operator=((Literal *)local_60,(Literal *)&extra.type);
      Literal::~Literal((Literal *)&extra.type);
    }
    if ((right != (Binary *)0x0) && (right->op == *(BinaryOp *)(&DAT_00df92e4 + uVar1 * 4))) {
      Literal::neg((Literal *)&extra.type,(Literal *)local_60);
      Literal::operator=((Literal *)local_60,(Literal *)&extra.type);
      Literal::~Literal((Literal *)&extra.type);
    }
    Literal::sub((Literal *)&extra.type,&rightConst->value,(Literal *)local_60);
    Literal::operator=(&rightConst->value,(Literal *)&extra.type);
    Literal::~Literal((Literal *)&extra.type);
    binary->left = left->left;
    Literal::~Literal((Literal *)local_60);
    return (Expression *)binary;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x1c4,"BasicType wasm::Type::getBasic() const");
}

Assistant:

Expression* combineRelationalConstants(Binary* binary,
                                         Binary* left,
                                         Const* leftConst,
                                         Binary* right,
                                         Const* rightConst) {
    auto type = binary->right->type;
    // we fold constants to the right
    Literal extra = leftConst->value;
    if (left->op == Abstract::getBinary(type, Abstract::Sub)) {
      extra = extra.neg();
    }
    if (right && right->op == Abstract::getBinary(type, Abstract::Sub)) {
      extra = extra.neg();
    }
    rightConst->value = rightConst->value.sub(extra);
    binary->left = left->left;
    return binary;
  }